

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  size_t this_00;
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmExportSet *pcVar5;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar6;
  string *psVar7;
  cmLocalGenerator *this_01;
  cmMakefile *this_02;
  char *pcVar8;
  ostream *poVar9;
  reference ppcVar10;
  reference config;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar11;
  bool local_6cd;
  bool local_691;
  bool local_66a;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_590;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  const_iterator ci;
  undefined1 local_578 [7];
  bool result;
  allocator local_551;
  string local_550;
  allocator local_529;
  string local_528;
  bool local_502;
  allocator local_501;
  undefined1 local_500 [6];
  bool newCMP0022Behavior;
  allocator local_4d9;
  string local_4d8;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  allocator local_461;
  string local_460;
  undefined1 local_440 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *gt;
  __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_400;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_3f8;
  const_iterator tei_1;
  undefined1 local_3e8 [4];
  bool requiresConfigFiles;
  bool require3_1_0;
  bool require3_0_0;
  bool require2_8_12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  undefined1 local_3b0 [8];
  string dest;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 local_370 [8];
  string absDestS;
  undefined1 local_330 [8];
  string absDest;
  string *expDest;
  string local_300;
  undefined1 local_2e0 [8];
  string installPrefix;
  string local_2b8 [32];
  undefined1 local_298 [8];
  ostringstream e;
  cmTargetExport *local_100;
  cmTargetExport *te;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_98 [3];
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_80;
  const_iterator tei;
  string sep;
  string expectedTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostream *os_local;
  cmExportInstallFileGenerator *this_local;
  
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::vector
            ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
             ((long)&expectedTargets.field_2 + 8));
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&tei);
  pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  pvVar6 = cmExportSet::GetTargetExports(pcVar5);
  local_80._M_current =
       (cmTargetExport **)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar6);
  do {
    pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
    pvVar6 = cmExportSet::GetTargetExports(pcVar5);
    local_98[0]._M_current =
         (cmTargetExport **)
         std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar6);
    bVar1 = __gnu_cxx::operator!=(&local_80,local_98);
    if (!bVar1) {
      cmExportFileGenerator::GenerateExpectedTargetsCode
                (&this->super_cmExportFileGenerator,os,(string *)((long)&sep.field_2 + 8));
      installPrefix.field_2._12_4_ = 0;
LAB_0077dcbf:
      std::__cxx11::string::~string((string *)&tei);
      std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
      if (installPrefix.field_2._12_4_ == 0) {
        this_01 = cmInstallExportGenerator::GetLocalGenerator(this->IEGen);
        this_02 = cmLocalGenerator::GetMakefile(this_01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_300,"CMAKE_INSTALL_PREFIX",(allocator *)((long)&expDest + 7));
        pcVar8 = cmMakefile::GetSafeDefinition(this_02,&local_300);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_2e0,pcVar8,(allocator *)((long)&expDest + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&expDest + 6));
        std::__cxx11::string::~string((string *)&local_300);
        std::allocator<char>::~allocator((allocator<char> *)((long)&expDest + 7));
        absDest.field_2._8_8_ = cmInstallExportGenerator::GetDestination_abi_cxx11_(this->IEGen);
        bVar1 = cmsys::SystemTools::FileIsFullPath((string *)absDest.field_2._8_8_);
        if (bVar1) {
          poVar9 = std::operator<<(os,
                                   "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \""
                                  );
          poVar9 = std::operator<<(poVar9,(string *)local_2e0);
          std::operator<<(poVar9,"\")\n\n");
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&absDestS.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e0,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_330,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&absDestS.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         absDest.field_2._8_8_);
          std::__cxx11::string::~string((string *)(absDestS.field_2._M_local_buf + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_330,"/");
          poVar9 = std::operator<<(os,"# Compute the installation prefix relative to this file.\n");
          poVar9 = std::operator<<(poVar9,"get_filename_component(_IMPORT_PREFIX");
          std::operator<<(poVar9," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
          local_378 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmHasLiteralPrefix<char_const*,6ul>(&local_378,(char (*) [6])0x91a0ed);
          local_66a = true;
          if (!bVar1) {
            local_380 = (char *)std::__cxx11::string::c_str();
            bVar1 = cmHasLiteralPrefix<char_const*,8ul>(&local_380,(char (*) [8])0x91a0f7);
            local_66a = true;
            if (!bVar1) {
              local_388 = (char *)std::__cxx11::string::c_str();
              bVar1 = cmHasLiteralPrefix<char_const*,10ul>(&local_388,(char (*) [10])"/usr/lib/");
              local_66a = true;
              if (!bVar1) {
                dest.field_2._8_8_ = std::__cxx11::string::c_str();
                local_66a = cmHasLiteralPrefix<char_const*,12ul>
                                      ((char **)((long)&dest.field_2 + 8),
                                       (char (*) [12])"/usr/lib64/");
              }
            }
          }
          if (local_66a != false) {
            poVar9 = std::operator<<(os,
                                     "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                                    );
            poVar9 = std::operator<<(poVar9,(string *)local_330);
            poVar9 = std::operator<<(poVar9,
                                     "\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                                    );
            poVar9 = std::operator<<(poVar9,(string *)local_330);
            std::operator<<(poVar9,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n");
          }
          std::__cxx11::string::string((string *)local_3b0,(string *)absDest.field_2._8_8_);
          while (bVar2 = std::__cxx11::string::empty(), ((bVar2 ^ 0xff) & 1) != 0) {
            std::operator<<(os,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n"
                           );
            cmsys::SystemTools::GetFilenamePath
                      ((string *)
                       &missingTargets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_3b0);
            std::__cxx11::string::operator=
                      ((string *)local_3b0,
                       (string *)
                       &missingTargets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &missingTargets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::operator<<(os,"\n");
          std::__cxx11::string::~string((string *)local_3b0);
          std::__cxx11::string::~string((string *)local_370);
          std::__cxx11::string::~string((string *)local_330);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3e8);
        tei_1._M_current._7_1_ = 0;
        tei_1._M_current._6_1_ = 0;
        tei_1._M_current._5_1_ = 0;
        tei_1._M_current._4_1_ = 0;
        local_400._M_current =
             (cmTargetExport **)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin
                       ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                        ((long)&expectedTargets.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<cmTargetExport*const*,std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>
        ::__normal_iterator<cmTargetExport**>
                  ((__normal_iterator<cmTargetExport*const*,std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>
                    *)&local_3f8,&local_400);
        while( true ) {
          gt = (cmGeneratorTarget *)
               std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end
                         ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                          ((long)&expectedTargets.field_2 + 8));
          bVar1 = __gnu_cxx::operator!=
                            (&local_3f8,
                             (__normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                              *)&gt);
          if (!bVar1) break;
          ppcVar10 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&local_3f8);
          properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(*ppcVar10)->Target;
          local_691 = true;
          if ((tei_1._M_current._4_1_ & 1) == 0) {
            TVar3 = cmGeneratorTarget::GetType
                              ((cmGeneratorTarget *)
                               properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_691 = TVar3 != INTERFACE_LIBRARY;
          }
          tei_1._M_current._4_1_ = local_691;
          cmExportFileGenerator::GenerateImportTargetCode
                    (&this->super_cmExportFileGenerator,os,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_440);
          ppcVar10 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&local_3f8);
          cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                    (&this->super_cmExportFileGenerator,*ppcVar10,InstallInterface,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          ppcVar10 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&local_3f8);
          cmExportFileGenerator::PopulateSourcesInterface
                    (&this->super_cmExportFileGenerator,*ppcVar10,InstallInterface,
                     (ImportPropertyMap *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_460,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_461);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_460,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          std::__cxx11::string::~string((string *)&local_460);
          std::allocator<char>::~allocator((allocator<char> *)&local_461);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_488,"INTERFACE_COMPILE_DEFINITIONS",&local_489);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_488,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator((allocator<char> *)&local_489);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4b0,"INTERFACE_COMPILE_OPTIONS",&local_4b1);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_4b0,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4d8,"INTERFACE_AUTOUIC_OPTIONS",&local_4d9);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_4d8,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_500,"INTERFACE_COMPILE_FEATURES",&local_501);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,(string *)local_500,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,InstallInterface,
                     (ImportPropertyMap *)local_440,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e8);
          std::__cxx11::string::~string((string *)local_500);
          std::allocator<char>::~allocator((allocator<char> *)&local_501);
          PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_6cd = false;
          if (PVar4 != WARN) {
            PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022
                              ((cmGeneratorTarget *)
                               properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_6cd = PVar4 != OLD;
          }
          local_502 = local_6cd;
          if (((local_6cd != false) &&
              (bVar1 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                 (&this->super_cmExportFileGenerator,
                                  (cmGeneratorTarget *)
                                  properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  InstallInterface,(ImportPropertyMap *)local_440,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_3e8), bVar1)) &&
             (((this->super_cmExportFileGenerator).ExportOld & 1U) == 0)) {
            tei_1._M_current._7_1_ = 1;
          }
          TVar3 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          this_00 = properties._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (TVar3 == INTERFACE_LIBRARY) {
            tei_1._M_current._6_1_ = 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_528,"INTERFACE_SOURCES",&local_529);
          pcVar8 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)this_00,&local_528);
          std::__cxx11::string::~string((string *)&local_528);
          std::allocator<char>::~allocator((allocator<char> *)&local_529);
          if (pcVar8 != (char *)0x0) {
            tei_1._M_current._5_1_ = 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_550,"INTERFACE_POSITION_INDEPENDENT_CODE",&local_551);
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_550,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_440);
          std::__cxx11::string::~string((string *)&local_550);
          std::allocator<char>::~allocator((allocator<char> *)&local_551);
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_440);
          cmExportFileGenerator::GenerateInterfaceProperties
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,
                     (ImportPropertyMap *)local_440);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_440);
          __gnu_cxx::
          __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
          ::operator++(&local_3f8);
        }
        if ((tei_1._M_current._5_1_ & 1) == 0) {
          if ((tei_1._M_current._6_1_ & 1) == 0) {
            if ((tei_1._M_current._7_1_ & 1) != 0) {
              cmExportFileGenerator::GenerateRequiredCMakeVersion
                        (&this->super_cmExportFileGenerator,os,"2.8.12");
            }
          }
          else {
            cmExportFileGenerator::GenerateRequiredCMakeVersion
                      (&this->super_cmExportFileGenerator,os,"3.0.0");
          }
        }
        else {
          cmExportFileGenerator::GenerateRequiredCMakeVersion
                    (&this->super_cmExportFileGenerator,os,"3.1.0");
        }
        poVar9 = std::operator<<(os,"# Load information for each installed configuration.\n");
        poVar9 = std::operator<<(poVar9,
                                 "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
                                );
        poVar9 = std::operator<<(poVar9,"file(GLOB CONFIG_FILES \"${_DIR}/");
        GetConfigImportFileGlob_abi_cxx11_((string *)local_578,this);
        poVar9 = std::operator<<(poVar9,(string *)local_578);
        poVar9 = std::operator<<(poVar9,"\")\n");
        poVar9 = std::operator<<(poVar9,"foreach(f ${CONFIG_FILES})\n");
        poVar9 = std::operator<<(poVar9,"  include(${f})\n");
        poVar9 = std::operator<<(poVar9,"endforeach()\n");
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)local_578);
        poVar9 = std::operator<<(os,"# Cleanup temporary variables.\n");
        poVar9 = std::operator<<(poVar9,"set(_IMPORT_PREFIX)\n");
        std::operator<<(poVar9,"\n");
        cmExportFileGenerator::GenerateImportedFileCheckLoop(&this->super_cmExportFileGenerator,os);
        ci._M_current._7_1_ = 1;
        if ((tei_1._M_current._4_1_ & 1) != 0) {
          local_590._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&(this->super_cmExportFileGenerator).Configurations);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_588,&local_590);
          while( true ) {
            local_598._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&(this->super_cmExportFileGenerator).Configurations);
            bVar1 = __gnu_cxx::operator!=(&local_588,&local_598);
            if (!bVar1) break;
            config = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_588);
            bVar1 = GenerateImportFileConfig
                              (this,config,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3e8);
            if (!bVar1) {
              ci._M_current._7_1_ = 0;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_588);
          }
        }
        cmExportFileGenerator::GenerateMissingTargetsCheckCode
                  (&this->super_cmExportFileGenerator,os,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3e8);
        this_local._7_1_ = ci._M_current._7_1_ & 1;
        installPrefix.field_2._12_4_ = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8);
        std::__cxx11::string::~string((string *)local_2e0);
      }
      std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~vector
                ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                 ((long)&expectedTargets.field_2 + 8));
      return (bool)(this_local._7_1_ & 1);
    }
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tei,
                   &(this->super_cmExportFileGenerator).Namespace);
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_80);
    cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&te,(*ppcVar10)->Target);
    std::operator+(&local_b8,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&te);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&te);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::operator=((string *)&tei," ");
    ppcVar10 = __gnu_cxx::
               __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
               ::operator*(&local_80);
    local_100 = *ppcVar10;
    pVar11 = std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&local_100->Target);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      poVar9 = std::operator<<((ostream *)local_298,"install(EXPORT \"");
      pcVar5 = cmInstallExportGenerator::GetExportSet(this->IEGen);
      psVar7 = cmExportSet::GetName_abi_cxx11_(pcVar5);
      poVar9 = std::operator<<(poVar9,(string *)psVar7);
      poVar9 = std::operator<<(poVar9,"\" ...) ");
      poVar9 = std::operator<<(poVar9,"includes target \"");
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_100->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar7);
      std::operator<<(poVar9,"\" more than once in the export set.");
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error(pcVar8,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string(local_2b8);
      this_local._7_1_ = 0;
      installPrefix.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      goto LAB_0077dcbf;
    }
    std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
              ((vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
               ((long)&expectedTargets.field_2 + 8),&local_100);
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&local_80);
  } while( true );
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
  std::string expectedTargets;
  std::string sep;
  for(std::vector<cmTargetExport*>::const_iterator
        tei = this->IEGen->GetExportSet()->GetTargetExports()->begin();
      tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei)
    {
    expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
    sep = " ";
    cmTargetExport * te = *tei;
    if(this->ExportedTargets.insert(te->Target).second)
      {
      allTargets.push_back(te);
      }
    else
      {
      std::ostringstream e;
      e << "install(EXPORT \""
        << this->IEGen->GetExportSet()->GetName()
        << "\" ...) " << "includes target \"" << te->Target->GetName()
        << "\" more than once in the export set.";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    }

  this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix = this->IEGen->GetLocalGenerator()
      ->GetMakefile()->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if(cmSystemTools::FileIsFullPath(expDest))
    {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    }
  else
    {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if(cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/"))
      {
      // Handle "/usr move" symlinks created by some Linux distros.
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      }
    std::string dest = expDest;
    while(!dest.empty())
      {
      os <<
        "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
      }
    os << "\n";
    }

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for(std::vector<cmTargetExport*>::const_iterator
        tei = allTargets.begin();
      tei != allTargets.end(); ++tei)
    {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles = requiresConfigFiles
                              || gt->GetType() != cmState::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateSourcesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES",
                                  gt,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);

    const bool newCMP0022Behavior =
        gt->GetPolicyStatusCMP0022() != cmPolicies::WARN
        && gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior)
      {
      if (this->PopulateInterfaceLinkLibrariesProperty(gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets)
          && !this->ExportOld)
        {
        require2_8_12 = true;
        }
      }
    if (gt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      require3_0_0 = true;
      }
    if(gt->GetProperty("INTERFACE_SOURCES"))
      {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
      }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE",
                                  gt, properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
    }

  if (require3_1_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
    }
  else if (require3_0_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
  else if (require2_8_12)
    {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
    }

  // Now load per-configuration properties for them.
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";

  // Cleanup the import prefix variable.
  os << "# Cleanup temporary variables.\n"
     << "set(_IMPORT_PREFIX)\n"
     << "\n";
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles)
    {
    for(std::vector<std::string>::const_iterator
          ci = this->Configurations.begin();
        ci != this->Configurations.end(); ++ci)
      {
      if(!this->GenerateImportFileConfig(*ci, missingTargets))
        {
        result = false;
        }
      }
    }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}